

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_estimateCCtxSize(int compressionLevel)

{
  size_t sVar1;
  undefined4 local_24;
  size_t newMB;
  size_t memBudget;
  int level;
  int compressionLevel_local;
  
  newMB = 0;
  local_24 = compressionLevel;
  if (0 < compressionLevel) {
    local_24 = 1;
  }
  for (memBudget._0_4_ = local_24; (int)memBudget <= compressionLevel;
      memBudget._0_4_ = (int)memBudget + 1) {
    sVar1 = ZSTD_estimateCCtxSize_internal((int)memBudget);
    if (newMB < sVar1) {
      newMB = sVar1;
    }
  }
  return newMB;
}

Assistant:

size_t ZSTD_estimateCCtxSize(int compressionLevel)
{
    int level;
    size_t memBudget = 0;
    for (level=MIN(compressionLevel, 1); level<=compressionLevel; level++) {
        /* Ensure monotonically increasing memory usage as compression level increases */
        size_t const newMB = ZSTD_estimateCCtxSize_internal(level);
        if (newMB > memBudget) memBudget = newMB;
    }
    return memBudget;
}